

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O2

void __thiscall brynet::net::DataSocket::normalFlush(DataSocket *this)

{
  element_type *peVar1;
  size_t __n;
  ulong uVar2;
  sock __fd;
  long *plVar3;
  void *pvVar4;
  _Elt_pointer ppVar5;
  ssize_t sVar6;
  int *piVar7;
  pointer __src;
  _Elt_pointer ppVar8;
  ulong uVar9;
  _Map_pointer pppVar10;
  ulong uVar11;
  _Elt_pointer ppVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  pointer local_a8;
  const_iterator local_78;
  iterator local_58;
  
  plVar3 = (long *)__tls_get_addr(&PTR_00155f70);
  if (*plVar3 == 0) {
    pvVar4 = malloc(0x8000);
    *plVar3 = (long)pvVar4;
  }
  ppVar5 = (this->mSendList).
           super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  do {
    ppVar8 = (this->mSendList).
             super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (ppVar5 == ppVar8) {
      return;
    }
    local_a8 = (pointer)*plVar3;
    ppVar12 = (this->mSendList).
              super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    pppVar10 = (this->mSendList).
               super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    uVar11 = 0;
    while (ppVar8 != ppVar5) {
      peVar1 = (ppVar8->data).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      __n = ppVar8->left;
      __src = (peVar1->_M_dataplus)._M_p + (peVar1->_M_string_length - __n);
      if (0x8000 < __n + uVar11) {
        if (ppVar8 == (this->mSendList).
                      super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          uVar11 = __n;
          local_a8 = __src;
        }
        break;
      }
      memcpy(local_a8 + uVar11,__src,__n);
      ppVar8 = ppVar8 + 1;
      if (ppVar8 == ppVar12) {
        ppVar8 = pppVar10[1];
        pppVar10 = pppVar10 + 1;
        ppVar12 = ppVar8 + 9;
      }
      uVar11 = __n + uVar11;
      ppVar5 = (this->mSendList).
               super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    }
    if (uVar11 == 0) {
      return;
    }
    __fd = TcpSocket::getFD((this->mSocket)._M_t.
                            super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
                            .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl);
    sVar6 = ::send(__fd,local_a8,(long)(int)uVar11,0);
    if ((int)(uint)sVar6 < 1) {
      piVar7 = __errno_location();
      if (*piVar7 != 0xb) {
        procCloseInLoop(this);
        return;
      }
      break;
    }
    uVar9 = (ulong)((uint)sVar6 & 0x7fffffff);
    uVar13 = uVar9;
    uVar14 = *(undefined4 *)
              &(this->mSendList).
               super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
    uVar15 = *(undefined4 *)
              ((long)&(this->mSendList).
                      super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last + 4);
    uVar16 = *(undefined4 *)
              &(this->mSendList).
               super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    uVar17 = *(undefined4 *)
              ((long)&(this->mSendList).
                      super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node + 4);
    ppVar8 = (this->mSendList).
             super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVar12 = (this->mSendList).
              super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
              ._M_impl.super__Deque_impl_data._M_start._M_first;
    while (ppVar5 = (this->mSendList).
                    super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur, ppVar8 != ppVar5) {
      uVar2 = ppVar8->left;
      if (uVar13 <= uVar2 && uVar2 - uVar13 != 0) {
        ppVar8->left = uVar2 - uVar13;
        break;
      }
      if ((ppVar8->mCompleteCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_()>::operator()(&ppVar8->mCompleteCallback);
      }
      uVar13 = uVar13 - uVar2;
      local_78._M_cur = ppVar8;
      local_78._M_first = ppVar12;
      local_78._M_last._0_4_ = uVar14;
      local_78._M_last._4_4_ = uVar15;
      local_78._M_node._0_4_ = uVar16;
      local_78._M_node._4_4_ = uVar17;
      std::
      deque<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
      ::erase(&local_58,&this->mSendList,&local_78);
      uVar14 = local_58._M_last._0_4_;
      uVar15 = local_58._M_last._4_4_;
      uVar16 = local_58._M_node._0_4_;
      uVar17 = local_58._M_node._4_4_;
      ppVar8 = local_58._M_cur;
      ppVar12 = local_58._M_first;
    }
  } while (uVar9 == uVar11);
  this->mCanWrite = false;
  checkWrite(this);
  return;
}

Assistant:

void DataSocket::normalFlush()
{
    static  const   int SENDBUF_SIZE = 1024 * 32;
    if (threadLocalSendBuf == nullptr)
    {
        threadLocalSendBuf = (char*)malloc(SENDBUF_SIZE);
    }

    bool must_close = false;

    while (!mSendList.empty())
    {
        char* sendptr = threadLocalSendBuf;
        size_t     wait_send_size = 0;

        for (auto it = mSendList.begin(); it != mSendList.end(); ++it)
        {
            auto& packet = *it;
            auto packetLeftBuf = (char*)(packet.data->c_str() + (packet.data->size() - packet.left));
            auto packetLeftLen = packet.left;

            if ((wait_send_size + packetLeftLen) > SENDBUF_SIZE)
            {
                if (it == mSendList.begin())
                {
                    sendptr = packetLeftBuf;
                    wait_send_size = packetLeftLen;
                }
                break;
            }

            memcpy(sendptr + wait_send_size, packetLeftBuf, packetLeftLen);
            wait_send_size += packetLeftLen;
        }

        if (wait_send_size <= 0)
        {
            break;
        }

        int send_retlen = 0;
#ifdef USE_OPENSSL
        if (mSSL != nullptr)
        {
            send_retlen = SSL_write(mSSL, sendptr, wait_send_size);
        }
        else
        {
            send_retlen = ::send(mSocket->getFD(), sendptr, wait_send_size, 0);
        }
#else
        send_retlen = ::send(mSocket->getFD(), sendptr, static_cast<int>(wait_send_size), 0);
#endif
        if (send_retlen <= 0)
        {

#ifdef USE_OPENSSL
            if ((mSSL != nullptr && SSL_get_error(mSSL, send_retlen) == SSL_ERROR_WANT_WRITE) ||
                (sErrno == S_EWOULDBLOCK))
            {
                mCanWrite = false;
                must_close = !checkWrite();
            }
            else
            {
                must_close = true;
            }
#else
            if (sErrno == S_EWOULDBLOCK)
            {
                mCanWrite = false;
                must_close = !checkWrite();
            }
            else
            {
                must_close = true;
            }
#endif
            break;
        }

        auto tmp_len = static_cast<size_t>(send_retlen);
        for (auto it = mSendList.begin(); it != mSendList.end();)
        {
            auto& packet = *it;
            if (packet.left > tmp_len)
            {
                packet.left -= tmp_len;
                break;
            }

            tmp_len -= packet.left;
            if (packet.mCompleteCallback != nullptr)
            {
                (packet.mCompleteCallback)();
            }
            it = mSendList.erase(it);
        }

        if (send_retlen != wait_send_size)
        {
            mCanWrite = false;
            must_close = !checkWrite();
            break;
        }
    }

    if (must_close)
    {
        procCloseInLoop();
    }
}